

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::CreatePolicyScopeSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot)

{
  PositionType position;
  ReferenceType pSVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  PointerType pSVar4;
  iterator iVar5;
  SnapshotDataType local_120;
  cmLinkedTree<cmState::SnapshotDataType> *local_38;
  PositionType PStack_30;
  undefined1 local_20 [8];
  PositionType pos;
  cmState *this_local;
  
  local_38 = originSnapshot.Position.Tree;
  PStack_30 = originSnapshot.Position.Position;
  pos.Position = (PositionType)this;
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType(&local_120,pSVar1);
  iVar5.Position = PStack_30;
  iVar5.Tree = local_38;
  iVar5 = cmLinkedTree<cmState::SnapshotDataType>::Push(&this->SnapshotData,iVar5,&local_120);
  pos.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)iVar5.Position;
  local_20 = (undefined1  [8])iVar5.Tree;
  SnapshotDataType::~SnapshotDataType(&local_120);
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar2->SnapshotType = PolicyScopeType;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pSVar2->Keep = false;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar2->BuildSystemDirectory);
  (pBVar3->DirectoryEnd).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_20;
  (pBVar3->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_20);
  (pSVar4->PolicyScope).Tree = (pSVar2->Policies).Tree;
  (pSVar4->PolicyScope).Position = (pSVar2->Policies).Position;
  position.Position = (PositionType)pos.Tree;
  position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_20;
  Snapshot::Snapshot(__return_storage_ptr__,this,position);
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreatePolicyScopeSnapshot(cmState::Snapshot originSnapshot)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->SnapshotType = PolicyScopeType;
  pos->Keep = false;
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}